

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

bool __thiscall
QLineEditPrivate::sendMouseEventToInputContext(QLineEditPrivate *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Action AVar4;
  uint uVar5;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  QRect QVar8;
  QArrayData *local_40;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidgetLineControl::composeMode((QWidgetLineControl *)this->control);
  if (bVar2) {
    dVar6 = (double)QEventPoint::position();
    dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar6;
    dVar7 = 2147483647.0;
    if (dVar6 <= 2147483647.0) {
      dVar7 = dVar6;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    QVar8 = adjustedContentsRect(this);
    iVar3 = QWidgetLineControl::xToPos
                      ((QWidgetLineControl *)this->control,
                       (this->hscroll - QVar8.x1.m_i) + (int)dVar7 + -2,CursorBetweenCharacters);
    uVar5 = iVar3 - this->control->m_cursor;
    if ((int)uVar5 < 0) {
      bVar2 = true;
    }
    else {
      QTextLayout::preeditAreaText();
      bVar2 = local_30 < uVar5;
      if (local_40 != (QArrayData *)0x0) {
        LOCK();
        (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40,2,0x10);
        }
      }
    }
    if (bVar2) {
      uVar5 = 0xffffffff;
    }
    if (-1 < (int)uVar5) {
      if (*(short *)(e + 8) == 3) {
        AVar4 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar4,0);
      }
      bVar2 = true;
      if (-1 < (int)uVar5) goto LAB_004281a4;
    }
  }
  bVar2 = false;
LAB_004281a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QLineEditPrivate::sendMouseEventToInputContext( QMouseEvent *e )
{
#if !defined QT_NO_IM
    if ( control->composeMode() ) {
        int tmp_cursor = xToPos(e->position().toPoint().x());
        int mousePos = tmp_cursor - control->cursor();
        if ( mousePos < 0 || mousePos > control->preeditAreaText().size() )
            mousePos = -1;

        if (mousePos >= 0) {
            if (e->type() == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, mousePos);

            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif

    return false;
}